

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatterTest_FormatSCharString_Test::TestBody(FormatterTest_FormatSCharString_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_1;
  char *const_str;
  AssertionResult gtest_ar;
  char str [5];
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  char (*in_stack_ffffffffffffff38) [5];
  char (*expected) [5];
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int line;
  string *file;
  Type in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  char (*in_stack_ffffffffffffff68) [6];
  AssertionResult local_78;
  undefined4 *local_68;
  Message *in_stack_ffffffffffffffa8;
  AssertHelper *in_stack_ffffffffffffffb0;
  string local_40 [32];
  AssertionResult local_20;
  undefined4 local_10;
  undefined1 local_c;
  
  local_c = 0;
  local_10 = 0x74736574;
  file = local_40;
  fmt::v5::format<char[6],signed_char[5]>
            (in_stack_ffffffffffffff68,(char (*) [5])in_stack_ffffffffffffff60);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  std::__cxx11::string::~string(local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  line = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x171bf6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)file,line,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    testing::Message::~Message((Message *)0x171c4a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x171c9f);
  local_68 = &local_10;
  expected = (char (*) [5])&stack0xffffffffffffff68;
  fmt::v5::format<char[6],signed_char_const*>
            (in_stack_ffffffffffffff68,(char **)in_stack_ffffffffffffff60);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40,expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    testing::AssertionResult::failure_message((AssertionResult *)0x171d7a);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,(char *)file,line,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_ffffffffffffff30));
    testing::Message::~Message((Message *)0x171dc6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x171e12);
  return;
}

Assistant:

TEST(FormatterTest, FormatSCharString) {
  signed char str[] = "test";
  EXPECT_EQ("test", format("{0:s}", str));
  const signed char *const_str = str;
  EXPECT_EQ("test", format("{0:s}", const_str));
}